

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O3

void __thiscall
QOpenGL2PaintEngineExPrivate::updateTexture<QImage>
          (QOpenGL2PaintEngineExPrivate *this,GLenum textureUnit,QImage *texture,GLenum wrapMode,
          GLenum filterMode,TextureUpdateMode updateMode)

{
  GLuint GVar1;
  GLuint GVar2;
  long in_FS_OFFSET;
  bool newTextureCreated;
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_39 = false;
  if (this->lastTextureUnitUsed != textureUnit) {
    (**(code **)(*(long *)&this->funcs + 0x178))(textureUnit + 0x84c0);
    this->lastTextureUnitUsed = textureUnit;
    this->lastTextureUsed = 0xffffffff;
  }
  GVar1 = bindTexture<QImage>(this,texture,&local_39);
  if (local_39 == false) {
    GVar2 = this->lastTextureUsed;
  }
  else {
    this->lastTextureUsed = 0xffffffff;
    GVar2 = 0xffffffff;
  }
  if ((updateMode != UpdateIfNeeded) || (GVar1 != GVar2)) {
    this->lastTextureUsed = GVar1;
    (**(code **)(*(long *)&this->funcs + 0x158))(0xde1,0x2802,wrapMode);
    (**(code **)(*(long *)&this->funcs + 0x158))(0xde1,0x2803,wrapMode);
    (**(code **)(*(long *)&this->funcs + 0x158))(0xde1,0x2800,filterMode);
    (**(code **)(*(long *)&this->funcs + 0x158))(0xde1,0x2801,filterMode);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGL2PaintEngineExPrivate::updateTexture(GLenum textureUnit, const T &texture, GLenum wrapMode, GLenum filterMode, TextureUpdateMode updateMode)
{
    static const GLenum target = GL_TEXTURE_2D;
    bool newTextureCreated = false;

    activateTextureUnit(textureUnit);

    GLuint textureId = bindTexture(texture, &newTextureCreated);

    if (newTextureCreated)
        lastTextureUsed = GLuint(-1);

    if (updateMode == UpdateIfNeeded && textureId == lastTextureUsed)
        return;

    lastTextureUsed = textureId;

    funcs.glTexParameteri(target, GL_TEXTURE_WRAP_S, wrapMode);
    funcs.glTexParameteri(target, GL_TEXTURE_WRAP_T, wrapMode);

    funcs.glTexParameteri(target, GL_TEXTURE_MAG_FILTER, filterMode);
    funcs.glTexParameteri(target, GL_TEXTURE_MIN_FILTER, filterMode);
}